

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamToolsIndex::InitializeFileSummary(BamToolsIndex *this,int *numReferences)

{
  int *in_RSI;
  vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  *in_RDI;
  int i;
  value_type *__x;
  BtiReferenceSummary local_28;
  int local_14;
  int *local_10;
  
  local_10 = in_RSI;
  std::
  vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  ::clear((vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
           *)0x1c50c1);
  for (local_14 = 0; local_14 < *local_10; local_14 = local_14 + 1) {
    __x = (value_type *)
          &in_RDI[2].
           super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    BtiReferenceSummary::BtiReferenceSummary(&local_28);
    std::
    vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
    ::push_back(in_RDI,__x);
  }
  return;
}

Assistant:

void BamToolsIndex::InitializeFileSummary(const int& numReferences) {
    m_indexFileSummary.clear();
    for ( int i = 0; i < numReferences; ++i )
        m_indexFileSummary.push_back( BtiReferenceSummary() );
}